

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

char * mp_encode_int(char *data,int64_t num)

{
  uint uVar1;
  long lVar2;
  
  if (num < 0) {
    if ((ulong)num < 0xffffffffffffffe0) {
      if ((ulong)num < 0xffffffffffffff80) {
        if ((ulong)num < 0xffffffffffff8000) {
          if ((ulong)num < 0xffffffff80000000) {
            *data = -0x2d;
            *(ulong *)(data + 1) =
                 (ulong)num >> 0x38 | (num & 0xff000000000000U) >> 0x28 |
                 (num & 0xff0000000000U) >> 0x18 | (num & 0xff00000000U) >> 8 |
                 (num & 0xff000000U) << 8 | (num & 0xff0000U) << 0x18 | (num & 0xff00U) << 0x28 |
                 num << 0x38;
            lVar2 = 9;
          }
          else {
            *data = -0x2e;
            uVar1 = (uint)num;
            *(uint *)(data + 1) =
                 uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
            lVar2 = 5;
          }
        }
        else {
          *data = -0x2f;
          *(ushort *)(data + 1) = (ushort)num << 8 | (ushort)num >> 8;
          lVar2 = 3;
        }
      }
      else {
        *data = -0x30;
        data[1] = (char)num;
        lVar2 = 2;
      }
    }
    else {
      *data = (char)num;
      lVar2 = 1;
    }
    return data + lVar2;
  }
  __assert_fail("num < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                ,0x6fb,"char *mp_encode_int(char *, int64_t)");
}

Assistant:

MP_IMPL char *
mp_encode_int(char *data, int64_t num)
{
	assert(num < 0);
	if (num >= -0x20) {
		return mp_store_u8(data, (uint8_t)(0xe0 | num));
	} else if (num >= INT8_MIN) {
		data = mp_store_u8(data, 0xd0);
		return mp_store_u8(data, (uint8_t)num);
	} else if (num >= INT16_MIN) {
		data = mp_store_u8(data, 0xd1);
		return mp_store_u16(data, (uint16_t)num);
	} else if (num >= INT32_MIN) {
		data = mp_store_u8(data, 0xd2);
		return mp_store_u32(data, (uint32_t)num);
	} else {
		data = mp_store_u8(data, 0xd3);
		return mp_store_u64(data, num);
	}
}